

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O0

bool_t beltHashStepV2(octet *hash,size_t hash_len,void *state)

{
  bool_t bVar1;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  belt_hash_st *st;
  
  beltHashStepG_internal(in_RDX);
  bVar1 = memEq(in_RDI,(void *)((long)in_RDX + 0x50),in_RSI);
  return bVar1;
}

Assistant:

bool_t beltHashStepV2(const octet hash[], size_t hash_len, void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	ASSERT(hash_len <= 32);
	ASSERT(memIsValid(hash, hash_len));
	beltHashStepG_internal(state);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevU32(st->h1);
	beltBlockRevU32(st->h1 + 4);
#endif
	return memEq(hash, st->h1, hash_len);
}